

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::Opnd::Free(Opnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Func *func_local;
  Opnd *this_local;
  
  bVar2 = IsInUse(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xde,"(!IsInUse())","Attempting to free in use operand.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  switch(this->m_kind) {
  case OpndKindIntConst:
    IntConstOpnd::FreeInternal((IntConstOpnd *)this,func);
    break;
  case OpndKindInt64Const:
    Int64ConstOpnd::FreeInternal((Int64ConstOpnd *)this,func);
    return;
  case OpndKindFloatConst:
    FloatConstOpnd::FreeInternal((FloatConstOpnd *)this,func);
    break;
  case OpndKindFloat32Const:
    Float32ConstOpnd::FreeInternal((Float32ConstOpnd *)this,func);
    break;
  case OpndKindSimd128Const:
    Simd128ConstOpnd::FreeInternal((Simd128ConstOpnd *)this,func);
    break;
  case OpndKindHelperCall:
    HelperCallOpnd::FreeInternal((HelperCallOpnd *)this,func);
    break;
  case OpndKindSym:
    SymOpnd::FreeInternal((SymOpnd *)this,func);
    break;
  case OpndKindReg:
    bVar2 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
    if (bVar2) {
      ArrayRegOpnd::FreeInternalSub((ArrayRegOpnd *)this,func);
    }
    else {
      RegOpnd::FreeInternal((RegOpnd *)this,func);
    }
    break;
  case OpndKindAddr:
    AddrOpnd::FreeInternal((AddrOpnd *)this,func);
    break;
  case OpndKindIndir:
    IndirOpnd::FreeInternal((IndirOpnd *)this,func);
    break;
  case OpndKindLabel:
    LabelOpnd::FreeInternal((LabelOpnd *)this,func);
    break;
  case OpndKindMemRef:
    MemRefOpnd::FreeInternal((MemRefOpnd *)this,func);
    break;
  case OpndKindRegBV:
    RegBVOpnd::FreeInternal((RegBVOpnd *)this,func);
    break;
  case OpndKindList:
    ListOpnd::FreeInternal((ListOpnd *)this,func);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x120,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
          HasDelayFreeList((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           func->m_alloc);
  if (bVar2) {
    this->isDeleted = true;
  }
  return;
}

Assistant:

void Opnd::Free(Func *func)
{
    AssertMsg(!IsInUse(), "Attempting to free in use operand.");

    switch (this->m_kind)
    {
    case OpndKindIntConst:
        //NOTE: use to be Sealed do not do sub class checks like in CloneUse
        static_cast<IntConstOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindInt64Const:
        return static_cast<Int64ConstOpnd*>(this)->FreeInternal(func);

    case OpndKindSimd128Const:
        static_cast<Simd128ConstOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindFloatConst:
        static_cast<FloatConstOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindFloat32Const:
        static_cast<Float32ConstOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindHelperCall:
        static_cast<HelperCallOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindSym:
        static_cast<SymOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindReg:
        if ((*static_cast<RegOpnd*>(this)).IsArrayRegOpnd())
        {
            static_cast<ArrayRegOpnd*>(this)->FreeInternalSub(func);
            break;
        }
        static_cast<RegOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindAddr:
        static_cast<AddrOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindIndir:
        static_cast<IndirOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindList:
        static_cast<ListOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindMemRef:
        static_cast<MemRefOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindLabel:
        static_cast<LabelOpnd*>(this)->FreeInternal(func);
        break;

    case OpndKindRegBV:
        static_cast<RegBVOpnd*>(this)->FreeInternal(func);
        break;

    default:
        Assert(UNREACHED);
        __assume(UNREACHED);

    };
#if DBG
    if (func->m_alloc->HasDelayFreeList())
    {
        this->isDeleted = true;
    }
#endif
}